

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  _Hash_node_base *p_Var1;
  pointer pcVar2;
  __node_base _Var3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  State *pSVar7;
  uint uVar8;
  string *psVar9;
  bool bVar10;
  int iVar11;
  bool bVar12;
  State *s;
  RWLocker l;
  unordered_map<re2::DFA::State_*,_int,_std::hash<re2::DFA::State_*>,_std::equal_to<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  State *local_f8;
  uint local_ec;
  State *local_e8;
  string *local_e0;
  pthread_rwlock_t *local_d8;
  RWLocker local_d0;
  _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  SearchParams local_88;
  
  if (this->init_failed_ != false) {
    return false;
  }
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_d0.mu_ = &this->cache_mutex_;
  local_d0.writing_ = false;
  iVar5 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_d0.mu_);
  if (iVar5 != 0) goto LAB_001b697d;
  local_88.text.data_ = (const_pointer)0x0;
  local_88.text.size_ = 0;
  local_88.start = (State *)0x0;
  local_88.context.data_ = (const_pointer)0x0;
  local_88.context.size_._0_7_ = 0;
  local_88.context.size_._7_1_ = 0;
  local_88.want_earliest_match = false;
  local_88.run_forward = false;
  local_88.first_byte = -1;
  local_88.cache_lock = &local_d0;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = (SparseSet *)0x0;
  local_88.anchored = true;
  bVar4 = AnalyzeSearch(this,&local_88);
  pSVar7 = local_88.start;
  if ((!bVar4) || (local_88.start == (State *)0x2)) {
    bVar4 = false;
    goto LAB_001b6653;
  }
  if (local_88.start == (State *)0x1) {
    std::__cxx11::string::_M_replace((ulong)min,0,(char *)min->_M_string_length,0x45fe91);
    bVar4 = true;
    std::__cxx11::string::_M_replace((ulong)max,0,(char *)max->_M_string_length,0x45fe91);
    goto LAB_001b6653;
  }
  local_f8 = local_88.start;
  min->_M_string_length = 0;
  *(min->_M_dataplus)._M_p = '\0';
  local_d8 = (pthread_rwlock_t *)&this->mutex_;
  iVar5 = pthread_rwlock_wrlock(local_d8);
  if (iVar5 != 0) goto LAB_001b697d;
  local_ec = maxlen;
  _Var3._M_nxt = local_c0._M_before_begin._M_nxt;
  if (maxlen < 1) {
joined_r0x001b67c4:
    while (_Var3._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = (_Var3._M_nxt)->_M_nxt;
      operator_delete(_Var3._M_nxt);
      _Var3._M_nxt = p_Var1;
    }
    psVar9 = (string *)0x0;
    memset(local_c0._M_buckets,0,local_c0._M_bucket_count << 3);
    local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_c0._M_element_count = 0;
    max->_M_string_length = 0;
    pcVar2 = (max->_M_dataplus)._M_p;
    *pcVar2 = '\0';
    local_e8 = (State *)CONCAT44(local_e8._4_4_,(int)CONCAT71((int7)((ulong)pcVar2 >> 8),1));
    local_f8 = pSVar7;
    if (maxlen < 1) {
      bVar4 = false;
    }
    else {
      bVar4 = false;
      do {
        pmVar6 = std::__detail::
                 _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_c0,&local_f8);
        if (0 < *pmVar6) break;
        pmVar6 = std::__detail::
                 _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_c0,&local_f8);
        *pmVar6 = *pmVar6 + 1;
        iVar5 = 0xff;
        bVar10 = false;
        local_e0 = psVar9;
        do {
          pSVar7 = RunStateOnByte(this,local_f8,iVar5);
          if (pSVar7 == (State *)0x0) {
            iVar11 = 1;
            bVar12 = false;
            bVar4 = false;
          }
          else {
            if (pSVar7 != (State *)0x2) {
              iVar11 = 0;
              bVar12 = true;
              if ((pSVar7 < (State *)0x3) || (pSVar7->ninst_ < 1)) goto LAB_001b68b1;
            }
            std::__cxx11::string::_M_replace_aux((ulong)max,max->_M_string_length,0,'\x01');
            bVar10 = true;
            iVar11 = 0xb;
            bVar12 = false;
            local_f8 = pSVar7;
          }
LAB_001b68b1:
          if (!bVar12) goto LAB_001b68c0;
          bVar12 = iVar5 != 0;
          iVar5 = iVar5 + -1;
        } while (bVar12);
        iVar11 = 0xb;
LAB_001b68c0:
        bVar12 = iVar11 == 0;
        if (iVar11 == 0xb) {
          bVar12 = bVar10;
        }
        bVar4 = (bool)(iVar11 == 0xb & (bVar10 ^ 1U) | bVar4);
        if (!bVar12) {
          local_e8 = (State *)((ulong)local_e8 & 0xffffffff00000000);
          break;
        }
        uVar8 = (int)local_e0 + 1;
        psVar9 = (string *)(ulong)uVar8;
      } while (uVar8 != local_ec);
    }
    if ((char)local_e8 != '\0') {
      PrefixSuccessor(max);
      bVar4 = max->_M_string_length != 0;
    }
  }
  else {
    local_e8 = pSVar7;
    uVar8 = 0;
    local_e0 = min;
    do {
      pmVar6 = std::__detail::
               _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0,&local_f8);
      iVar5 = 2;
      if (0 < *pmVar6) break;
      pmVar6 = std::__detail::
               _Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0,&local_f8);
      *pmVar6 = *pmVar6 + 1;
      pSVar7 = RunStateOnByte(this,local_f8,0x100);
      iVar5 = 1;
      if (pSVar7 == (State *)0x0) {
LAB_001b6765:
        bVar4 = false;
      }
      else {
        if ((pSVar7 != (State *)0x1) && ((pSVar7 == (State *)0x2 || ((pSVar7->flag_ & 0x100) != 0)))
           ) {
          iVar5 = 2;
          goto LAB_001b6765;
        }
        iVar11 = 0;
        do {
          pSVar7 = RunStateOnByte(this,local_f8,iVar11);
          if (pSVar7 == (State *)0x0) goto LAB_001b675b;
          if ((pSVar7 == (State *)0x2) || (((State *)0x2 < pSVar7 && (0 < pSVar7->ninst_)))) {
            std::__cxx11::string::_M_replace_aux
                      ((ulong)local_e0,local_e0->_M_string_length,0,'\x01');
            iVar5 = 0;
            bVar4 = true;
            maxlen = local_ec;
            local_f8 = pSVar7;
            goto LAB_001b6795;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0x100);
        iVar5 = 2;
LAB_001b675b:
        bVar4 = false;
        maxlen = local_ec;
      }
LAB_001b6795:
      if (!bVar4) break;
      uVar8 = uVar8 + 1;
      iVar5 = 2;
    } while (uVar8 != maxlen);
    _Var3._M_nxt = local_c0._M_before_begin._M_nxt;
    pSVar7 = local_e8;
    if (iVar5 == 2) goto joined_r0x001b67c4;
    bVar4 = false;
  }
  iVar5 = pthread_rwlock_unlock(local_d8);
  if (iVar5 == 0) {
LAB_001b6653:
    RWLocker::~RWLocker(&local_d0);
    std::
    _Hashtable<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<re2::DFA::State_*>,_std::hash<re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_c0);
    return bVar4;
  }
LAB_001b697d:
  abort();
}

Assistant:

bool DFA::PossibleMatchRange(std::string* min, std::string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  std::unordered_map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions)
      break;
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  PrefixSuccessor(max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}